

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool DivisionNegativeCornerCaseHelper<int,_unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::NegativeCornerCase
               (unsigned_long_long lhs,
               SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = lhs;
  uVar3 = SUB168(auVar1 / ZEXT416((uint)-rhs.m_int),0);
  if (uVar3 < 0x80000000) {
    iVar2 = -SUB164(auVar1 / ZEXT416((uint)-rhs.m_int),0);
  }
  else {
    iVar2 = -0x80000000;
    if (uVar3 != 0x80000000) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
  }
  result->m_int = iVar2;
  return true;
}

Assistant:

SAFE_INT_NODISCARD static bool NegativeCornerCase( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        // Problem case - normal casting behavior changes meaning
        // flip rhs to positive
        // any operator casts now do the right thing
        U tmp = division_negative_negateU< T, U, sizeof(T) == 4>::div(rhs, lhs);

        if( tmp <= (U)std::numeric_limits<T>::max() )
        {
            result = SafeInt< T, E >( (T)(~(std::uint64_t)tmp + 1) );
            return true;
        }

        // Corner case
        T maxT = std::numeric_limits<T>::max();
        if( tmp == (U)maxT + 1 )
        {
            T minT = std::numeric_limits<T>::min();
            result = SafeInt< T, E >( minT );
            return true;
        }

        E::SafeIntOnOverflow();
    }